

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

int __thiscall
soplex::SPxFastRT<double>::maxSelect
          (SPxFastRT<double> *this,double *val,double *stab,double *bestDelta,double max)

{
  SPxSolverBase<double> *pSVar1;
  int iVar2;
  long in_FS_OFFSET;
  double best;
  
  ::soplex::infinity::__tls_init();
  best = -*(double *)(in_FS_OFFSET + -8);
  *bestDelta = 0.0;
  pSVar1 = (this->super_SPxRatioTester<double>).thesolver;
  iVar2 = maxSelect(this,val,stab,&best,bestDelta,max,pSVar1->theFvec,&pSVar1->theLBbound,
                    &pSVar1->theUBbound,0,1);
  return iVar2;
}

Assistant:

int SPxFastRT<R>::maxSelect(
   R& val,
   R& stab,
   R& bestDelta,
   R max)
{
   R best = R(-infinity);
   bestDelta = 0.0;
   assert(this->m_type == SPxSolverBase<R>::ENTER);
   return maxSelect(val, stab, best, bestDelta, max,
                    this->thesolver->fVec(), this->thesolver->lbBound(), this->thesolver->ubBound(),  0, 1);
}